

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O1

size_t check_for_leftover_values
                 (ListNode *map_head,char *error_message,size_t number_of_symbol_names)

{
  ListNode *map_head_00;
  undefined8 *puVar1;
  ListNode *pLVar2;
  size_t sVar3;
  ListNode *pLVar4;
  
  if (map_head == (ListNode *)0x0) {
    cm_print_error("%s\n","map_head");
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O1/_deps/cmocka-src/src/cmocka.c"
          ,0x39a);
  }
  if (number_of_symbol_names == 0) {
    cm_print_error("%s\n","number_of_symbol_names");
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O1/_deps/cmocka-src/src/cmocka.c"
          ,0x39b);
  }
  pLVar4 = map_head->next;
  if (pLVar4 == map_head) {
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
    do {
      puVar1 = (undefined8 *)pLVar4->value;
      if (puVar1 == (undefined8 *)0x0) {
        cm_print_error("%s\n","value");
        _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O1/_deps/cmocka-src/src/cmocka.c"
              ,0x3a2);
      }
      map_head_00 = (ListNode *)(puVar1 + 1);
      if ((ListNode *)puVar1[3] != map_head_00) {
        if (number_of_symbol_names == 1) {
          cm_print_error(error_message,"%s");
          for (pLVar2 = (ListNode *)puVar1[3]; pLVar2 != map_head_00; pLVar2 = pLVar2->next) {
            cm_print_error("%s:%u: note: remaining item was declared here\n",*pLVar2->value,
                           (ulong)*(uint *)((long)pLVar2->value + 8));
          }
        }
        else {
          cm_print_error("%s: ",*puVar1);
          check_for_leftover_values(map_head_00,error_message,1);
        }
        sVar3 = sVar3 + 1;
      }
      pLVar4 = pLVar4->next;
    } while (pLVar4 != map_head);
  }
  return sVar3;
}

Assistant:

static size_t check_for_leftover_values(
        const ListNode * const map_head, const char * const error_message,
        const size_t number_of_symbol_names) {
    const ListNode *current;
    size_t symbols_with_leftover_values = 0;
    assert_non_null(map_head);
    assert_true(number_of_symbol_names);

    for (current = map_head->next; current != map_head;
         current = current->next) {
        const SymbolMapValue * const value =
            (SymbolMapValue*)current->value;
        const ListNode *child_list;
        assert_non_null(value);
        child_list = &value->symbol_values_list_head;

        if (!list_empty(child_list)) {
            if (number_of_symbol_names == 1) {
                const ListNode *child_node;
                cm_print_error(error_message, "%s", value->symbol_name);

                for (child_node = child_list->next; child_node != child_list;
                     child_node = child_node->next) {
                    const SourceLocation * const location =
                        (const SourceLocation*)child_node->value;
                    cm_print_error(SOURCE_LOCATION_FORMAT
                                   ": note: remaining item was declared here\n",
                                   location->file, location->line);
                }
            } else {
                cm_print_error("%s: ", value->symbol_name);
                check_for_leftover_values(child_list, error_message,
                                          number_of_symbol_names - 1);
            }
            symbols_with_leftover_values ++;
        }
    }
    return symbols_with_leftover_values;
}